

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::BasicAtomicCase4CS::Run(BasicAtomicCase4CS *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  undefined8 *puVar3;
  void *pvVar4;
  ulong uVar5;
  long lVar6;
  char *format;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "\nlayout(local_size_x = 2, local_size_y = 2, local_size_z = 2) in;\nlayout(std430, binding = 0) coherent buffer Counters {\n  uint g_uint_counter;\n  int g_int_counter;\n};\nlayout(std430, binding = 1) buffer Output {\n  uint udata[8];\n  int idata[8];\n} g_output;\nvoid main() {\n  uint uidx = atomicAdd(g_uint_counter, 1u);\n  int iidx = atomicAdd(g_int_counter, -1);\n  g_output.udata[uidx] = uidx;\n  g_output.idata[iidx] = iidx;\n}"
             ,"");
  GVar2 = ShaderStorageBufferObjectBase::CreateProgramCS
                    (&this->super_ShaderStorageBufferObjectBase,&local_38);
  this->m_program = GVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                    (&this->super_ShaderStorageBufferObjectBase,this->m_program);
  lVar6 = -1;
  if (bVar1) {
    glu::CallLogWrapper::glGenBuffers(this_00,2,this->m_storage_buffer);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer[0]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,8,(void *)0x0,0x88e8);
    puVar3 = (undefined8 *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,8,2);
    if (puVar3 != (undefined8 *)0x0) {
      *puVar3 = 0x700000000;
      glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_storage_buffer[1]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x40,(void *)0x0,0x88e8);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
      pvVar4 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x20,1);
      if (pvVar4 != (void *)0x0) {
        uVar5 = 0;
        do {
          if (uVar5 != *(uint *)((long)pvVar4 + uVar5 * 4)) {
            format = "uData at index %d is %d should be %d.\n";
            goto LAB_00965954;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != 8);
        glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
        pvVar4 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0x20,0x20,1);
        if (pvVar4 != (void *)0x0) {
          uVar5 = 0;
          do {
            if (uVar5 != *(uint *)((long)pvVar4 + uVar5 * 4)) {
              format = "iData at index %d is %d should be %d.\n";
LAB_00965954:
              anon_unknown_0::Output(format,uVar5 & 0xffffffff);
              return -1;
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 != 8);
          glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
          lVar6 = 0;
        }
      }
    }
  }
  return lVar6;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 2, local_size_y = 2, local_size_z = 2) in;" NL
			   "layout(std430, binding = 0) coherent buffer Counters {" NL "  uint g_uint_counter;" NL
			   "  int g_int_counter;" NL "};" NL "layout(std430, binding = 1) buffer Output {" NL "  uint udata[8];" NL
			   "  int idata[8];" NL "} g_output;" NL "void main() {" NL
			   "  uint uidx = atomicAdd(g_uint_counter, 1u);" NL "  int iidx = atomicAdd(g_int_counter, -1);" NL
			   "  g_output.udata[uidx] = uidx;" NL "  g_output.idata[iidx] = iidx;" NL "}";
		m_program = CreateProgramCS(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(2, m_storage_buffer);
		/* counter buffer */
		{
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, 2 * sizeof(int), NULL, GL_DYNAMIC_DRAW);
			int* ptr = reinterpret_cast<int*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 8, GL_MAP_WRITE_BIT));
			if (!ptr)
				return ERROR;
			*ptr++ = 0;
			*ptr++ = 7;
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		/* output buffer */
		{
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, 16 * sizeof(int), NULL, GL_DYNAMIC_DRAW);
		}
		glUseProgram(m_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		GLuint* udata = (GLuint*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 32, GL_MAP_READ_BIT);
		if (!udata)
			return ERROR;
		for (GLuint i = 0; i < 8; ++i)
		{
			if (udata[i] != i)
			{
				Output("uData at index %d is %d should be %d.\n", i, udata[i], i);
				return ERROR;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		GLint* idata = (GLint*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 32, 32, GL_MAP_READ_BIT);
		if (!idata)
			return ERROR;
		for (GLint i = 0; i < 8; ++i)
		{
			if (idata[i] != i)
			{
				Output("iData at index %d is %d should be %d.\n", i, idata[i], i);
				return ERROR;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		return NO_ERROR;
	}